

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O1

bool __thiscall VPPOperator::Prepare(VPPOperator *this,RunContext *ctx)

{
  pointer pcVar1;
  Connection *pCVar2;
  pointer pCVar3;
  Block *b;
  long *plVar4;
  CommandBlock *pCVar5;
  Connection *c;
  pointer pCVar6;
  long *plVar7;
  Connection *c_1;
  Pipeline *pPVar8;
  bool bVar9;
  ulong uVar10;
  Pipeline *pPVar11;
  ulong uVar12;
  string fifo;
  string fifoname;
  string command;
  vector<Connection_*,_std::allocator<Connection_*>_> outputs;
  string from;
  string to2;
  string to;
  string local_1d8;
  undefined1 local_1b8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  long local_190;
  char local_188 [16];
  Connection **local_178;
  iterator iStack_170;
  Connection **local_168;
  Pipeline *local_160;
  Pipeline *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100 [16];
  long *local_f0;
  long local_e8;
  long local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_198._M_current = local_188;
  pcVar1 = (this->command)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar1,pcVar1 + (this->command)._M_string_length);
  if (0 < this->ninputs) {
    uVar12 = 0;
    do {
      pCVar3 = (pointer)0x0;
      for (pCVar6 = (this->super_BaseNode).connections.
                    super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar6 != (this->super_BaseNode).connections.
                    super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                    super__Vector_impl_data._M_finish; pCVar6 = pCVar6 + 1) {
        if (((VPPOperator *)pCVar6->input_node == this) &&
           (pCVar6->input_slot == PipeInputSlotNames[uVar12])) {
          pCVar3 = pCVar6;
        }
      }
      if (pCVar3 == (pointer)0x0) {
        bVar9 = false;
        printf("input slot %d not connected?\n",uVar12 & 0xffffffff);
        goto LAB_001578f2;
      }
      RunContext::MakeOrGetFifo_abi_cxx11_
                ((string *)local_1b8,ctx,pCVar3->input_node,pCVar3->input_slot,pCVar3->output_node,
                 pCVar3->output_slot);
      local_158 = (Pipeline *)local_1b8._8_8_;
      if ((Pipeline *)local_1b8._8_8_ == (Pipeline *)0x0) {
        printf("slot %d not prepared\n",uVar12 & 0xffffffff);
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150,
                   PipeInputSlotNames[uVar12],0x10);
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_local_buf[0] = '\0';
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::
        __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                  (&local_1d8,local_198,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_198._M_current + local_190),
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150,
                   (char *)local_1b8._0_8_,local_1b8._8_8_,0);
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150);
      }
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      if (local_158 == (Pipeline *)0x0) goto LAB_001578f0;
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)this->ninputs);
  }
  if (this->noutputs < 1) {
LAB_00157813:
    pCVar5 = (CommandBlock *)operator_new(0x50);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_198._M_current,local_198._M_current + local_190);
    (pCVar5->super_Block)._vptr_Block = (_func_int **)&PTR__CommandBlock_00190c80;
    (pCVar5->command)._M_dataplus._M_p = (pointer)&(pCVar5->command).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pCVar5->command,local_70,local_70 + local_68);
    pCVar5->process = (Process *)0x0;
    (pCVar5->consoleOutput)._M_dataplus._M_p = (pointer)&(pCVar5->consoleOutput).field_2;
    (pCVar5->consoleOutput)._M_string_length = 0;
    (pCVar5->consoleOutput).field_2._M_local_buf[0] = '\0';
    this->block = pCVar5;
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    bVar9 = true;
    Pipeline::Add(&ctx->pipeline,&this->block->super_Block);
  }
  else {
    local_158 = &ctx->pipeline;
    pPVar11 = (Pipeline *)0x0;
    while( true ) {
      local_178 = (Connection **)0x0;
      iStack_170._M_current = (Connection **)0x0;
      local_168 = (Connection **)0x0;
      pCVar3 = (this->super_BaseNode).connections.
               super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar6 = (this->super_BaseNode).connections.
                    super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar6 != pCVar3; pCVar6 = pCVar6 + 1) {
        if (((VPPOperator *)pCVar6->output_node == this) &&
           (pCVar6->output_slot == PipeOutputSlotNames[(long)pPVar11])) {
          local_1b8._0_8_ = pCVar6;
          if (iStack_170._M_current == local_168) {
            std::vector<Connection*,std::allocator<Connection*>>::_M_realloc_insert<Connection*>
                      ((vector<Connection*,std::allocator<Connection*>> *)&local_178,iStack_170,
                       (Connection **)local_1b8);
          }
          else {
            *iStack_170._M_current = pCVar6;
            iStack_170._M_current = iStack_170._M_current + 1;
          }
        }
      }
      if (local_178 == iStack_170._M_current) break;
      local_1b8._8_8_ = (Pipeline *)0x0;
      local_1b8[0x10] = '\0';
      local_1b8._0_8_ = (pointer)(local_1b8 + 0x10);
      if ((long)iStack_170._M_current - (long)local_178 == 8) {
        pCVar2 = *local_178;
        RunContext::MakeOrGetFifo_abi_cxx11_
                  (&local_1d8,ctx,pCVar2->input_node,pCVar2->input_slot,pCVar2->output_node,
                   pCVar2->output_slot);
        std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
      }
      else {
        RunContext::MakeFifo_abi_cxx11_(&local_1d8,ctx);
        local_160 = pPVar11;
        std::__cxx11::string::_M_assign((string *)local_1b8);
        if ((long)iStack_170._M_current - (long)local_178 != 8) {
          uVar12 = 0;
          uVar10 = 1;
          do {
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,local_1d8._M_dataplus._M_p,
                       local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
            local_110 = local_100;
            local_108 = 0;
            local_100[0] = 0;
            if (((long)iStack_170._M_current - (long)local_178 >> 3) - 2U == uVar12) {
              pCVar2 = local_178[uVar10];
              RunContext::MakeOrGetFifo_abi_cxx11_
                        (&local_130,ctx,pCVar2->input_node,pCVar2->input_slot,pCVar2->output_node,
                         pCVar2->output_slot);
              std::__cxx11::string::operator=((string *)&local_110,(string *)&local_130);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p);
              }
            }
            else {
              RunContext::MakeFifo_abi_cxx11_(&local_130,ctx);
              std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_130);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p);
              }
              std::__cxx11::string::_M_assign((string *)&local_110);
            }
            pCVar2 = local_178[uVar12];
            RunContext::MakeOrGetFifo_abi_cxx11_
                      (&local_130,ctx,pCVar2->input_node,pCVar2->input_slot,pCVar2->output_node,
                       pCVar2->output_slot);
            b = (Block *)operator_new(0x50);
            std::operator+(&local_50,"vp dup ",&local_150);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_d0 = &local_c0;
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_c0 = *plVar7;
              lStack_b8 = plVar4[3];
            }
            else {
              local_c0 = *plVar7;
              local_d0 = (long *)*plVar4;
            }
            local_c8 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_110);
            local_b0 = &local_a0;
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_a0 = *plVar7;
              lStack_98 = plVar4[3];
            }
            else {
              local_a0 = *plVar7;
              local_b0 = (long *)*plVar4;
            }
            local_a8 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_90 = &local_80;
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_80 = *plVar7;
              lStack_78 = plVar4[3];
            }
            else {
              local_80 = *plVar7;
              local_90 = (long *)*plVar4;
            }
            local_88 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_90,(ulong)local_130._M_dataplus._M_p);
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_e0 = *plVar7;
              uStack_d8 = (undefined4)plVar4[3];
              uStack_d4 = *(undefined4 *)((long)plVar4 + 0x1c);
              local_f0 = &local_e0;
            }
            else {
              local_e0 = *plVar7;
              local_f0 = (long *)*plVar4;
            }
            local_e8 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            b->_vptr_Block = (_func_int **)&PTR__CommandBlock_00190c80;
            b[1]._vptr_Block = (_func_int **)(b + 3);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(b + 1),local_f0,local_e8 + (long)local_f0);
            b[5]._vptr_Block = (_func_int **)0x0;
            b[6]._vptr_Block = (_func_int **)(b + 8);
            b[7]._vptr_Block = (_func_int **)0x0;
            *(undefined1 *)&b[8]._vptr_Block = 0;
            Pipeline::Add(local_158,b);
            if (local_f0 != &local_e0) {
              operator_delete(local_f0);
            }
            if (local_90 != &local_80) {
              operator_delete(local_90);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p);
            }
            if (local_110 != local_100) {
              operator_delete(local_110);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
            bVar9 = uVar10 < ((long)iStack_170._M_current - (long)local_178 >> 3) - 1U;
            uVar12 = uVar10;
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (bVar9);
        }
        pPVar11 = local_160;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
          pPVar11 = local_160;
        }
      }
      pPVar8 = (Pipeline *)local_1b8._8_8_;
      if ((Pipeline *)local_1b8._8_8_ == (Pipeline *)0x0) {
        printf("slot %d not prepared\n",(ulong)pPVar11 & 0xffffffff);
      }
      else {
        local_160 = (Pipeline *)local_1b8._8_8_;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150,
                   PipeOutputSlotNames[(long)pPVar11],0x10);
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_local_buf[0] = '\0';
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::
        __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                  (&local_1d8,local_198,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_198._M_current + local_190),
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150,
                   (char *)local_1b8._0_8_,local_1b8._8_8_,0);
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150);
        pPVar8 = local_160;
      }
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      if (local_178 != (Connection **)0x0) {
        operator_delete(local_178);
      }
      if (pPVar8 == (Pipeline *)0x0) goto LAB_001578f0;
      pPVar11 = (Pipeline *)
                ((long)&(pPVar11->blocks).super__Vector_base<Block_*,_std::allocator<Block_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1);
      if ((long)this->noutputs <= (long)pPVar11) goto LAB_00157813;
    }
    printf("output slot %d not connected?\n",(ulong)pPVar11 & 0xffffffff);
    if (local_178 != (Connection **)0x0) {
      operator_delete(local_178);
    }
LAB_001578f0:
    bVar9 = false;
  }
LAB_001578f2:
  if (local_198._M_current != local_188) {
    operator_delete(local_198._M_current);
  }
  return bVar9;
}

Assistant:

virtual bool Prepare(RunContext& ctx) override
    {
        std::string command = this->command;
        for (int i = 0; i < ninputs; i++) {
            Connection* con = nullptr;
            for (auto& c : connections)
            {
                if (c.input_node != this || c.input_slot != PipeInputSlotNames[i])
                    continue;
                con = &c;
            }
            if (!con) {
                printf("input slot %d not connected?\n", i);
                return false;
            }
            const std::string& name = con->GetFifoName(ctx);
            if (name.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeInputSlotNames[i]), name);
        }
        // TODO: duplicate output if multiple inputs use it
        for (int i = 0; i < noutputs; i++) {
            std::vector<Connection*> outputs;
            for (auto& c : connections)
            {
                if (c.output_node != this || c.output_slot != PipeOutputSlotNames[i])
                    continue;
                outputs.push_back(&c);
            }
            if (outputs.empty()) {
                printf("output slot %d not connected?\n", i);
                return false;
            }
            std::string fifoname;
            if (outputs.size() == 1)
            {
                fifoname = outputs[0]->GetFifoName(ctx);
            }
            else
            {
                // multiple outputs, so we need to duplicate the stream
                // XXX: this is vpp specific
                auto fifo = ctx.MakeFifo();
                fifoname = fifo;
                for (unsigned i = 0; i < outputs.size() - 1; i++)
                {
                    std::string from = fifo;
                    std::string to;
                    if (i == outputs.size() - 2)
                    {
                        to = outputs[i+1]->GetFifoName(ctx);
                    }
                    else
                    {
                        fifo = ctx.MakeFifo();
                        to = fifo;
                    }
                    std::string to2 = outputs[i]->GetFifoName(ctx);
                    ctx.CollectBlock(new CommandBlock("vp dup " + from + " " + to + " " + to2));
                }
            }
            if (fifoname.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeOutputSlotNames[i]), fifoname);
        }

        block = new CommandBlock(command);
        ctx.CollectBlock(block);
        return true;
    }